

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormatLite::Int64Size(RepeatedField<long> *value)

{
  long lVar1;
  int iVar2;
  ulong *puVar3;
  int index;
  size_t sVar4;
  
  iVar2 = SooRep::size(&value->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
  index = 0;
  if (iVar2 < 1) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    do {
      puVar3 = (ulong *)RepeatedField<long>::Get(value,index);
      lVar1 = 0x3f;
      if ((*puVar3 | 1) != 0) {
        for (; (*puVar3 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar2 != index);
  }
  return sVar4;
}

Assistant:

size_t WireFormatLite::Int64Size(const RepeatedField<int64_t>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += Int64Size(value.Get(i));
  }
  return out;
}